

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

UBool isMatchAtCPBoundary(UChar *start,UChar *match,UChar *matchLimit,UChar *limit)

{
  if ((((start == match) || ((*match & 0xfc00U) != 0xdc00)) || ((match[-1] & 0xfc00U) != 0xd800)) &&
     (((match == limit || ((matchLimit[-1] & 0xfc00U) != 0xd800)) ||
      ((*matchLimit & 0xfc00U) != 0xdc00)))) {
    return '\x01';
  }
  return '\0';
}

Assistant:

static inline UBool
isMatchAtCPBoundary(const UChar *start, const UChar *match, const UChar *matchLimit, const UChar *limit) {
    if(U16_IS_TRAIL(*match) && start!=match && U16_IS_LEAD(*(match-1))) {
        /* the leading edge of the match is in the middle of a surrogate pair */
        return FALSE;
    }
    if(U16_IS_LEAD(*(matchLimit-1)) && match!=limit && U16_IS_TRAIL(*matchLimit)) {
        /* the trailing edge of the match is in the middle of a surrogate pair */
        return FALSE;
    }
    return TRUE;
}